

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int cpool_add(JSParseState *s,JSValue val)

{
  long lVar1;
  int iVar2;
  undefined8 *puVar3;
  void **in_RDX;
  undefined8 in_RSI;
  int *in_RDI;
  JSFunctionDef *fd;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar1 = *(long *)(in_RDI + 0x1a);
  iVar2 = js_resize_array((JSContext *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          ,in_RDX,(int)((ulong)in_RSI >> 0x20),in_RDI,(int)((ulong)lVar1 >> 0x20));
  if (iVar2 == 0) {
    iVar2 = *(int *)(lVar1 + 400);
    *(int *)(lVar1 + 400) = iVar2 + 1;
    puVar3 = (undefined8 *)(*(long *)(lVar1 + 0x188) + (long)iVar2 * 0x10);
    *puVar3 = in_RSI;
    puVar3[1] = in_RDX;
    iVar2 = *(int *)(lVar1 + 400) + -1;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int cpool_add(JSParseState *s, JSValue val)
{
    JSFunctionDef *fd = s->cur_func;
    
    if (js_resize_array(s->ctx, (void *)&fd->cpool, sizeof(fd->cpool[0]),
                        &fd->cpool_size, fd->cpool_count + 1))
        return -1;
    fd->cpool[fd->cpool_count++] = val;
    return fd->cpool_count - 1;
}